

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O2

bool chaiscript::dispatch::detail::
     compare_types_cast<void,henson::ChaiScheduler*,std::__cxx11::string,std::__cxx11::string,chaiscript::Boxed_Value,std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>,int,0ul,1ul,2ul,3ul,4ul,5ul>
               (undefined8 param_1,long *param_2,Type_Conversions_State *param_3,
               Type_Conversions_State *param_4)

{
  chaiscript local_90 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  Result_Type local_80;
  Result_Type local_60;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  local_40;
  
  boxed_cast<henson::ChaiScheduler*>((Boxed_Value *)*param_2,param_3);
  boxed_cast<std::__cxx11::string>
            (&local_60,(chaiscript *)(*param_2 + 0x10),(Boxed_Value *)param_3,param_4);
  boxed_cast<std::__cxx11::string>
            (&local_80,(chaiscript *)(*param_2 + 0x20),(Boxed_Value *)param_3,param_4);
  boxed_cast<chaiscript::Boxed_Value>(local_90,(Boxed_Value *)(*param_2 + 0x30),param_3);
  boxed_cast<std::map<std::__cxx11::string,chaiscript::Boxed_Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>>
            ((Result_Type *)&local_40,(chaiscript *)(*param_2 + 0x40),(Boxed_Value *)param_3,param_4
            );
  boxed_cast<int>((Boxed_Value *)(*param_2 + 0x50),param_3);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>
  ::~_Rb_tree(&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  return true;
}

Assistant:

bool compare_types_cast(Indexes<I...>, Ret (*)(Params...),
             const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions)
        {
          try {
            (void)params; (void)t_conversions;
            (void)std::initializer_list<int>{(boxed_cast<Params>(params[I], &t_conversions), 0)...};
            return true;
          } catch (const exception::bad_boxed_cast &) {
            return false;
          }

        }